

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

UploadSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
          *samples,bool logBucketPerformance)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pUVar3;
  pointer pfVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log_00;
  undefined8 uVar6;
  deUint64 *pdVar7;
  int *piVar8;
  pointer pUVar9;
  SampleBuilder *pSVar10;
  ulong target;
  long lVar11;
  int endNdx;
  long lVar12;
  size_type __n;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  UploadSampleAnalyzeResult UVar21;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section_1;
  size_type __dnew_1;
  LineParametersWithConfidence theilSenFitting;
  ScopedLogSection section;
  ScopedLogSection section_2;
  StatsType resultStats;
  undefined1 local_ae8 [12];
  float fStack_adc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ad8;
  string local_ac8;
  string local_aa8;
  qpSampleValueTag local_a88;
  float local_a84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a80;
  undefined1 local_a78 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a68;
  string local_a58;
  string local_a38;
  qpSampleValueTag local_a18;
  float local_a14;
  LogNumber<float> local_a10;
  undefined1 local_9a8 [16];
  undefined1 local_990 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_980;
  LogNumber<float> local_970;
  LogNumber<float> local_908;
  LogNumber<float> local_8a0;
  string local_838;
  LogNumber<float> local_818;
  LogNumber<float> local_7b0;
  LogNumber<float> local_748;
  LogNumber<float> local_6e0;
  LogNumber<float> local_678;
  LineParametersWithConfidence local_60c;
  string local_5f0;
  string local_5d0;
  string local_5b0;
  string local_590;
  string local_570;
  string local_550;
  string local_530;
  string local_510;
  string local_4f0;
  string local_4d0;
  string local_4b0;
  string local_490;
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  LogNumber<float> local_3b0;
  string local_348;
  string local_328;
  string local_308;
  float local_2e4;
  float local_2e0;
  float local_2dc;
  float local_2d8;
  float local_2d4;
  float local_2d0;
  float local_2cc;
  float local_2c8;
  float local_2c4;
  float local_2c0;
  float local_2bc;
  string local_2b8;
  ScopedLogSection local_298;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  SingleOperationStatistics local_10c;
  SingleOperationStatistics local_f8;
  SingleOperationStatistics local_e4;
  SingleOperationStatistics local_d0 [2];
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  undefined4 uStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            (&local_60c,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a78,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)local_ae8);
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = (long)(samples->
              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9 >> 6;
  uVar14 = (uint)__n;
  if (0 < (int)uVar14) {
    pdVar7 = &(pUVar9->duration).fitResponseDuration;
    uVar13 = 0;
    do {
      *(deUint64 *)(local_a78._0_8_ + uVar13 * 8) = *pdVar7;
      uVar13 = uVar13 + 1;
      pdVar7 = pdVar7 + 8;
    } while ((uVar14 & 0x7fffffff) != uVar13);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae8,__n,(allocator_type *)&local_a10);
  uVar5 = local_ae8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 6);
  if (0 < (int)uVar14) {
    piVar8 = &pUVar9->writtenSize;
    uVar13 = 0;
    do {
      *(float *)(local_ae8._0_8_ + uVar13 * 4) =
           (float)*piVar8 / (((float)*(ulong *)(local_a78._0_8_ + uVar13 * 8) / 1000.0) / 1000.0);
      uVar13 = uVar13 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar14 & 0x7fffffff) != uVar13);
  }
  pfVar4 = (pointer)CONCAT44(fStack_adc,local_ae8._8_4_);
  if ((pointer)local_ae8._0_8_ != pfVar4) {
    uVar13 = (long)pfVar4 - local_ae8._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae8._0_8_,pfVar4,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ae8._0_8_;
  fVar16 = (float)((CONCAT44(fStack_adc,local_ae8._8_4_) - local_ae8._0_8_ >> 2) - 1) * 0.5;
  fVar17 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar17;
  local_94 = (1.0 - fVar16) * *(float *)(uVar5 + (long)(int)fVar17 * 4) +
             fVar16 * *(float *)(uVar5 + (long)((int)fVar17 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ad8._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae8,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a10);
  uVar5 = local_ae8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 6);
  if (0 < (int)uVar14) {
    piVar8 = &pUVar9->writtenSize;
    uVar13 = 0;
    do {
      *(float *)(local_ae8._0_8_ + uVar13 * 4) =
           (float)*(ulong *)(local_a78._0_8_ + uVar13 * 8) -
           ((float)*piVar8 * local_60c.coefficient + local_60c.offset);
      uVar13 = uVar13 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar14 & 0x7fffffff) != uVar13);
  }
  pfVar4 = (pointer)CONCAT44(fStack_adc,local_ae8._8_4_);
  if ((pointer)local_ae8._0_8_ != pfVar4) {
    uVar13 = (long)pfVar4 - local_ae8._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae8._0_8_,pfVar4,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ae8._0_8_;
  uStack_90 = *(undefined4 *)(CONCAT44(fStack_adc,local_ae8._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_adc,local_ae8._8_4_) - local_ae8._0_8_ >> 2) - 1);
  local_9a8._0_4_ = fVar17 * 0.9;
  fVar16 = floorf((float)local_9a8._0_4_);
  fStack_8c = (1.0 - ((float)local_9a8._0_4_ - (float)(int)fVar16)) *
              *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              ((float)local_9a8._0_4_ - (float)(int)fVar16) *
              *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  fStack_88 = (1.0 - fVar17) * *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              fVar17 * *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ad8._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ae8,
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(samples->
                   super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 6,(allocator_type *)&local_a10);
  uVar5 = local_ae8._0_8_;
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar14 = (uint)((ulong)((long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 6);
  if (0 < (int)uVar14) {
    piVar8 = &pUVar9->writtenSize;
    uVar13 = 0;
    do {
      fVar16 = (float)*piVar8 * local_60c.coefficient + local_60c.offset;
      fVar17 = 0.0;
      if (1.0 <= fVar16) {
        fVar17 = ((float)*(ulong *)(local_a78._0_8_ + uVar13 * 8) - fVar16) / fVar16;
      }
      *(float *)(local_ae8._0_8_ + uVar13 * 4) = fVar17;
      uVar13 = uVar13 + 1;
      piVar8 = piVar8 + 0x10;
    } while ((uVar14 & 0x7fffffff) != uVar13);
  }
  pfVar4 = (pointer)CONCAT44(fStack_adc,local_ae8._8_4_);
  if ((pointer)local_ae8._0_8_ != pfVar4) {
    uVar13 = (long)pfVar4 - local_ae8._0_8_ >> 2;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ae8._0_8_,pfVar4,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  local_84 = *(undefined4 *)(CONCAT44(fStack_adc,local_ae8._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_adc,local_ae8._8_4_) - local_ae8._0_8_ >> 2) - 1);
  fVar16 = fVar17 * 0.9;
  local_9a8._0_4_ = fVar16;
  fVar16 = floorf(fVar16);
  local_80 = (1.0 - ((float)local_9a8._0_4_ - (float)(int)fVar16)) *
             *(float *)(local_ae8._0_8_ + (long)(int)fVar16 * 4) +
             ((float)local_9a8._0_4_ - (float)(int)fVar16) *
             *(float *)(local_ae8._0_8_ + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  local_7c = (1.0 - fVar17) * *(float *)(local_ae8._0_8_ + (long)(int)fVar16 * 4) +
             fVar17 * *(float *)(local_ae8._0_8_ + (long)((int)fVar16 + 1) * 4);
  if ((pointer)local_ae8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity - local_ae8._0_8_);
  }
  uVar6 = local_a78._8_8_;
  uVar5 = local_a78._0_8_;
  if (local_a78._0_8_ != local_a78._8_8_) {
    uVar13 = (long)(local_a78._8_8_ - local_a78._0_8_) >> 3;
    lVar11 = 0x3f;
    if (uVar13 != 0) {
      for (; uVar13 >> lVar11 == 0; lVar11 = lVar11 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a78._0_8_,local_a78._8_8_,((uint)lVar11 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,uVar6);
  }
  local_a8 = (float)*(ulong *)local_a78._0_8_;
  local_a4 = (float)(ulong)(((pointer)(local_a78._8_8_ + -0x10))->value).int64;
  fVar17 = (float)(((long)(local_a78._8_8_ - local_a78._0_8_) >> 3) - 1);
  local_9a8._0_4_ = fVar17 * 0.5;
  fVar16 = floorf(fVar17 * 0.5);
  local_a0 = (float)*(ulong *)(local_a78._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9a8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a78._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9a8._0_4_ - (float)(int)fVar16));
  local_9a8._0_4_ = fVar17 * 0.1;
  fVar16 = floorf(fVar17 * 0.1);
  local_9c = (float)*(ulong *)(local_a78._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9a8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a78._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9a8._0_4_ - (float)(int)fVar16));
  fVar16 = floorf(fVar17 * 0.9);
  uVar13 = *(ulong *)(local_a78._0_8_ + (long)(int)fVar16 * 8);
  target = uVar13;
  if ((long)uVar13 < 0) {
    target = (ulong)((uint)uVar13 & 1) | uVar13 >> 1;
  }
  fVar17 = fVar17 * 0.9 - (float)(int)fVar16;
  uVar2 = *(ulong *)(local_a78._0_8_ + (long)((int)fVar16 + 1) * 8);
  if ((long)uVar2 < 0) {
    target = uVar2 >> 1;
  }
  local_98 = (float)uVar2 * fVar17 + (float)uVar13 * (1.0 - fVar17);
  operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity - local_a78._0_8_);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&local_10c,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x0,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&local_f8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x8,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (&local_e4,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x10,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>>
            (local_d0,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
              *)0x18,target);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Samples","");
  local_ae8._0_8_ = &local_ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_2b8,log,(string *)local_a78,(string *)local_ae8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  local_908.m_name._M_dataplus._M_p = (pointer)&local_908.m_name.field_2;
  local_908.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_908.m_name.field_2._M_local_buf[4] = 'l';
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x7365;
  local_908.m_name._M_string_length = 7;
  local_908.m_name.field_2._M_local_buf[7] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_678.m_name._M_string_length = 7;
  local_678.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_3b0,&local_908.m_name,&local_678.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_3b0.m_name,&local_3b0.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7257;
  local_6e0.m_name.field_2._M_local_buf[2] = 'i';
  local_6e0.m_name.field_2._M_allocated_capacity._3_4_ = 0x6e657474;
  local_6e0.m_name.field_2._7_4_ = 0x657a6953;
  local_6e0.m_name._M_string_length = 0xb;
  local_6e0.m_name.field_2._M_local_buf[0xb] = '\0';
  local_980._M_allocated_capacity = 0x206e657474697257;
  local_980._8_4_ = 0x657a6973;
  local_990._8_8_ = 0xc;
  local_980._M_local_buf[0xc] = '\0';
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  local_838.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_838.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_838._M_string_length = 5;
  local_990._0_8_ = &local_980;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a78,&local_6e0.m_name,(string *)local_990,&local_838,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  local_a80 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log;
  tcu::TestLog::writeValueInfo(log,(string *)local_a78,&local_a58,&local_a38,local_a18);
  local_308.field_2._M_allocated_capacity = 0x6953726566667542;
  local_308.field_2._8_2_ = 0x657a;
  local_308._M_string_length = 10;
  local_308.field_2._M_local_buf[10] = '\0';
  local_328.field_2._M_allocated_capacity._0_7_ = 0x20726566667542;
  local_328.field_2._7_4_ = 0x657a6973;
  local_328._M_string_length = 0xb;
  local_328.field_2._M_local_buf[0xb] = '\0';
  local_348.field_2._M_allocated_capacity._0_4_ = 0x65747962;
  local_348.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_348._M_string_length = 5;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_ae8,&local_308,&local_328,&local_348,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,(string *)local_ae8,&local_ac8,&local_aa8,
             local_a88);
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  local_3d0.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_3d0.field_2._8_2_ = 0x65;
  local_3d0._M_string_length = 9;
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  local_3f0.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_3f0.field_2._8_2_ = 0x656d;
  local_3f0._M_string_length = 10;
  local_3f0.field_2._M_local_buf[10] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  local_410.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_410._M_string_length = 2;
  local_410.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_a10,&local_3d0,&local_3f0,&local_410,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_a10.m_name,&local_a10.m_desc,
             &local_a10.m_unit,local_a10.m_tag);
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  local_430.field_2._M_allocated_capacity._0_4_ = 0x5470614d;
  local_430._M_string_length = 7;
  local_430.field_2._M_allocated_capacity._4_4_ = 0x656d69;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450.field_2._M_allocated_capacity = 0x656d69742070614d;
  local_450._M_string_length = 8;
  local_450.field_2._M_local_buf[8] = '\0';
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  local_470.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_470._M_string_length = 2;
  local_470.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_8a0,&local_430,&local_450,&local_470,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_8a0.m_name,&local_8a0.m_desc,
             &local_8a0.m_unit,local_8a0.m_tag);
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  local_490.field_2._M_allocated_capacity = 0x6d695470616d6e55;
  local_490.field_2._8_2_ = 0x65;
  local_490._M_string_length = 9;
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  local_4b0.field_2._M_allocated_capacity = 0x69742070616d6e55;
  local_4b0.field_2._8_2_ = 0x656d;
  local_4b0._M_string_length = 10;
  local_4b0.field_2._M_local_buf[10] = '\0';
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  local_4d0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4d0._M_string_length = 2;
  local_4d0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_7b0,&local_490,&local_4b0,&local_4d0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_7b0.m_name,&local_7b0.m_desc,
             &local_7b0.m_unit,local_7b0.m_tag);
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  local_4f0.field_2._M_allocated_capacity = 0x6d69546574697257;
  local_4f0.field_2._8_2_ = 0x65;
  local_4f0._M_string_length = 9;
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  local_510.field_2._M_allocated_capacity = 0x6974206574697257;
  local_510.field_2._8_2_ = 0x656d;
  local_510._M_string_length = 10;
  local_510.field_2._M_local_buf[10] = '\0';
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  local_530.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_530._M_string_length = 2;
  local_530.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_748,&local_4f0,&local_510,&local_530,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_748.m_name,&local_748.m_desc,
             &local_748.m_unit,local_748.m_tag);
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  local_550.field_2._M_allocated_capacity = 0x6d69546873756c46;
  local_550.field_2._8_2_ = 0x65;
  local_550._M_string_length = 9;
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  local_570.field_2._M_allocated_capacity = 0x6974206873756c46;
  local_570.field_2._8_2_ = 0x656d;
  local_570._M_string_length = 10;
  local_570.field_2._M_local_buf[10] = '\0';
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  local_590.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_590._M_string_length = 2;
  local_590.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_970,&local_550,&local_570,&local_590,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_970.m_name,&local_970.m_desc,
             &local_970.m_unit,local_970.m_tag);
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  local_5b0.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_5b0.field_2._7_4_ = 0x6c617564;
  local_5b0._M_string_length = 0xb;
  local_5b0.field_2._M_local_buf[0xb] = '\0';
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  local_5d0.field_2._M_allocated_capacity = 0x6973657220746946;
  local_5d0.field_2._8_4_ = 0x6c617564;
  local_5d0._M_string_length = 0xc;
  local_5d0.field_2._M_local_buf[0xc] = '\0';
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  local_5f0.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_5f0._M_string_length = 2;
  local_5f0.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_818,&local_5b0,&local_5d0,&local_5f0,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  paVar1 = local_a80;
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a80->_M_allocated_capacity,&local_818.m_name,&local_818.m_desc,
             &local_818.m_unit,local_818.m_tag);
  tcu::TestLog::endSampleInfo((TestLog *)&paVar1->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_unit._M_dataplus._M_p != &local_818.m_unit.field_2) {
    operator_delete(local_818.m_unit._M_dataplus._M_p,
                    local_818.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_desc._M_dataplus._M_p != &local_818.m_desc.field_2) {
    operator_delete(local_818.m_desc._M_dataplus._M_p,
                    local_818.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    local_818.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,
                    CONCAT53(local_5f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.field_2._M_local_buf[2],
                                      local_5f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,
                    CONCAT17(local_5b0.field_2._M_local_buf[7],
                             local_5b0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_unit._M_dataplus._M_p != &local_970.m_unit.field_2) {
    operator_delete(local_970.m_unit._M_dataplus._M_p,
                    local_970.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_desc._M_dataplus._M_p != &local_970.m_desc.field_2) {
    operator_delete(local_970.m_desc._M_dataplus._M_p,
                    local_970.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT53(local_590.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_590.field_2._M_local_buf[2],
                                      local_590.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_unit._M_dataplus._M_p != &local_748.m_unit.field_2) {
    operator_delete(local_748.m_unit._M_dataplus._M_p,
                    local_748.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_desc._M_dataplus._M_p != &local_748.m_desc.field_2) {
    operator_delete(local_748.m_desc._M_dataplus._M_p,
                    local_748.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT53(local_530.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_530.field_2._M_local_buf[2],
                                      local_530.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_unit._M_dataplus._M_p != &local_7b0.m_unit.field_2) {
    operator_delete(local_7b0.m_unit._M_dataplus._M_p,
                    local_7b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_desc._M_dataplus._M_p != &local_7b0.m_desc.field_2) {
    operator_delete(local_7b0.m_desc._M_dataplus._M_p,
                    local_7b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT53(local_4d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4d0.field_2._M_local_buf[2],
                                      local_4d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_unit._M_dataplus._M_p != &local_8a0.m_unit.field_2) {
    operator_delete(local_8a0.m_unit._M_dataplus._M_p,
                    local_8a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_desc._M_dataplus._M_p != &local_8a0.m_desc.field_2) {
    operator_delete(local_8a0.m_desc._M_dataplus._M_p,
                    local_8a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT53(local_470.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_470.field_2._M_local_buf[2],
                                      local_470.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT44(local_430.field_2._M_allocated_capacity._4_4_,
                             local_430.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_348.field_2._M_allocated_capacity._4_2_,
                                      local_348.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT17(local_328.field_2._M_local_buf[7],
                             local_328.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,
                    CONCAT26(local_838.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_838.field_2._M_allocated_capacity._4_2_,
                                      local_838.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._0_8_ != &local_980) {
    operator_delete((void *)local_990._0_8_,local_980._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_desc._M_dataplus._M_p != &local_3b0.m_desc.field_2) {
    operator_delete(local_3b0.m_desc._M_dataplus._M_p,
                    local_3b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9) >> 6)) {
    lVar12 = 0;
    lVar11 = 0;
    do {
      uVar13 = *(ulong *)((long)&(pUVar9->duration).fitResponseDuration + lVar12);
      local_9a8._0_4_ =
           (float)*(int *)((long)&pUVar9->writtenSize + lVar12) * local_60c.coefficient +
           local_60c.offset;
      local_a78._0_8_ = local_a80;
      local_a78._8_8_ = (pointer)0x0;
      aStack_a68._M_allocated_capacity = 0;
      aStack_a68._8_8_ = 0;
      pSVar10 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a78,*(int *)((long)&pUVar9->writtenSize + lVar12))
      ;
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  bufferSize + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).totalDuration + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).mapDuration + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).unmapDuration + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).writeDuration + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).flushDuration + lVar12));
      pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,(float)uVar13 - (float)local_9a8._0_4_);
      tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a78._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a78._8_8_,aStack_a68._8_8_ - local_a78._8_8_);
      }
      lVar11 = lVar11 + 1;
      pUVar9 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar12 = lVar12 + 0x40;
    } while (lVar11 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pUVar9
                                   ) >> 6));
  }
  log_00 = local_a80;
  tcu::TestLog::endSampleList((TestLog *)&local_a80->_M_allocated_capacity);
  tcu::TestLog::endSection((TestLog *)local_2b8._M_dataplus._M_p);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Contribution","");
  local_ae8._0_8_ = &local_ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"Contributions","");
  paVar1 = &local_908.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_838,(TestLog *)&log_00->_M_allocated_capacity,
             (string *)local_a78,(string *)local_ae8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_990,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0);
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  local_8a0.m_name.field_2._M_allocated_capacity._0_7_ = 0x736e6f4370614d;
  local_8a0.m_name.field_2._M_local_buf[7] = 't';
  local_8a0.m_name.field_2._8_7_ = 0x74736f43746e61;
  local_8a0.m_name._M_string_length = 0xf;
  local_8a0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_7b0.m_name._M_dataplus._M_p = (pointer)&local_7b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b0,"Map: Approximated contant cost","");
  local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
  local_748.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_748.m_name._M_string_length = 2;
  local_748.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8a0.m_name,&local_7b0.m_name,&local_748.m_name,
             QP_KEY_TAG_TIME,(float)local_990._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a78._0_8_,
             local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,local_a18,local_a14);
  local_970.m_name._M_dataplus._M_p = (pointer)&local_970.m_name.field_2;
  local_970.m_name.field_2._M_allocated_capacity._0_5_ = 0x694c70614d;
  local_970.m_name.field_2._M_allocated_capacity._5_2_ = 0x656e;
  local_970.m_name.field_2._M_local_buf[7] = 'a';
  local_970.m_name.field_2._8_5_ = 0x74736f4372;
  local_970.m_name._M_string_length = 0xd;
  local_970.m_name.field_2._M_local_buf[0xd] = '\0';
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1d;
  local_818.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_818,(ulong)&local_a10);
  local_818.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_818.m_name._M_dataplus._M_p,"Map: Approximated linear cost",0x1d);
  local_818.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_818.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_3b0.m_name._M_dataplus._M_p = (pointer)&local_3b0.m_name.field_2;
  local_3b0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3b0.m_name._M_string_length = 7;
  local_3b0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae8,&local_970.m_name,&local_818.m_name,&local_3b0.m_name,
             QP_KEY_TAG_TIME,(float)local_990._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ae8._0_8_,
             local_ac8._M_dataplus._M_p,local_aa8._M_dataplus._M_p,local_a88,local_a84);
  local_908.m_name.field_2._M_allocated_capacity._0_4_ = 0x4d70614d;
  local_908.m_name.field_2._M_local_buf[4] = 'e';
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x6964;
  local_908.m_name.field_2._M_local_buf[7] = 'a';
  local_908.m_name.field_2._8_5_ = 0x74736f436e;
  local_908.m_name._M_string_length = 0xd;
  local_908.m_name.field_2._M_local_buf[0xd] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_6e0.m_name._M_dataplus._M_p = (pointer)0x10;
  local_908.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_6e0);
  local_678.m_name.field_2._M_allocated_capacity = (size_type)local_6e0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Map: Median cost",0x10);
  local_678.m_name._M_string_length = (size_type)local_6e0.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_6e0.m_name._M_dataplus._M_p] = '\0';
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_908.m_name,&local_678.m_name,&local_6e0.m_name,QP_KEY_TAG_TIME,
             local_10c.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_a10.m_name._M_dataplus._M_p,
             local_a10.m_desc._M_dataplus._M_p,local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,
             local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    (ulong)(local_818.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_990,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,8);
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"UnmapConstantCost","");
  local_7b0.m_name._M_dataplus._M_p = (pointer)&local_7b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b0,"Unmap: Approximated contant cost","");
  local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
  local_748.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_748.m_name._M_string_length = 2;
  local_748.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8a0.m_name,&local_7b0.m_name,&local_748.m_name,
             QP_KEY_TAG_TIME,(float)local_990._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a78._0_8_,
             local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,local_a18,local_a14);
  local_970.m_name._M_dataplus._M_p = (pointer)&local_970.m_name.field_2;
  local_970.m_name.field_2._M_allocated_capacity._0_5_ = 0x70616d6e55;
  local_970.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_970.m_name.field_2._M_local_buf[7] = 'n';
  local_970.m_name.field_2._8_5_ = 0x6f43726165;
  local_970.m_name.field_2._M_local_buf[0xd] = 's';
  local_970.m_name.field_2._M_local_buf[0xe] = 't';
  local_970.m_name._M_string_length = 0xf;
  local_970.m_name.field_2._M_local_buf[0xf] = '\0';
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1f;
  local_818.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_818,(ulong)&local_a10);
  local_818.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_818.m_name._M_dataplus._M_p,"Unmap: Approximated linear cost",0x1f);
  local_818.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_818.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_3b0.m_name._M_dataplus._M_p = (pointer)&local_3b0.m_name.field_2;
  local_3b0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3b0.m_name._M_string_length = 7;
  local_3b0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae8,&local_970.m_name,&local_818.m_name,&local_3b0.m_name,
             QP_KEY_TAG_TIME,(float)local_990._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ae8._0_8_,
             local_ac8._M_dataplus._M_p,local_aa8._M_dataplus._M_p,local_a88,local_a84);
  local_908.m_name.field_2._M_allocated_capacity._0_4_ = 0x616d6e55;
  local_908.m_name.field_2._M_local_buf[4] = 'p';
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_908.m_name.field_2._M_local_buf[7] = 'd';
  local_908.m_name.field_2._8_5_ = 0x6f436e6169;
  local_908.m_name.field_2._M_local_buf[0xd] = 's';
  local_908.m_name.field_2._M_local_buf[0xe] = 't';
  local_908.m_name._M_string_length = 0xf;
  local_908.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_6e0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_908.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_6e0);
  local_678.m_name.field_2._M_allocated_capacity = (size_type)local_6e0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Unmap: Median cost",0x12);
  local_678.m_name._M_string_length = (size_type)local_6e0.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_6e0.m_name._M_dataplus._M_p] = '\0';
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_908.m_name,&local_678.m_name,&local_6e0.m_name,QP_KEY_TAG_TIME,
             local_f8.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_a10.m_name._M_dataplus._M_p,
             local_a10.m_desc._M_dataplus._M_p,local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,
             local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    (ulong)(local_818.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_990,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x10);
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"WriteConstantCost","");
  local_7b0.m_name._M_dataplus._M_p = (pointer)&local_7b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b0,"Write: Approximated contant cost","");
  local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
  local_748.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_748.m_name._M_string_length = 2;
  local_748.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8a0.m_name,&local_7b0.m_name,&local_748.m_name,
             QP_KEY_TAG_TIME,(float)local_990._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a78._0_8_,
             local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,local_a18,local_a14);
  local_970.m_name._M_dataplus._M_p = (pointer)&local_970.m_name.field_2;
  local_970.m_name.field_2._M_allocated_capacity._0_5_ = 0x6574697257;
  local_970.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_970.m_name.field_2._M_local_buf[7] = 'n';
  local_970.m_name.field_2._8_5_ = 0x6f43726165;
  local_970.m_name.field_2._M_local_buf[0xd] = 's';
  local_970.m_name.field_2._M_local_buf[0xe] = 't';
  local_970.m_name._M_string_length = 0xf;
  local_970.m_name.field_2._M_local_buf[0xf] = '\0';
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1f;
  local_818.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_818,(ulong)&local_a10);
  local_818.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_818.m_name._M_dataplus._M_p,"Write: Approximated linear cost",0x1f);
  local_818.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_818.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_3b0.m_name._M_dataplus._M_p = (pointer)&local_3b0.m_name.field_2;
  local_3b0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3b0.m_name._M_string_length = 7;
  local_3b0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae8,&local_970.m_name,&local_818.m_name,&local_3b0.m_name,
             QP_KEY_TAG_TIME,(float)local_990._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ae8._0_8_,
             local_ac8._M_dataplus._M_p,local_aa8._M_dataplus._M_p,local_a88,local_a84);
  local_908.m_name.field_2._M_allocated_capacity._0_4_ = 0x74697257;
  local_908.m_name.field_2._M_local_buf[4] = 'e';
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_908.m_name.field_2._M_local_buf[7] = 'd';
  local_908.m_name.field_2._8_5_ = 0x6f436e6169;
  local_908.m_name.field_2._M_local_buf[0xd] = 's';
  local_908.m_name.field_2._M_local_buf[0xe] = 't';
  local_908.m_name._M_string_length = 0xf;
  local_908.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_6e0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_908.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_6e0);
  local_678.m_name.field_2._M_allocated_capacity = (size_type)local_6e0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Write: Median cost",0x12);
  local_678.m_name._M_string_length = (size_type)local_6e0.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_6e0.m_name._M_dataplus._M_p] = '\0';
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_908.m_name,&local_678.m_name,&local_6e0.m_name,QP_KEY_TAG_TIME,
             local_e4.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_a10.m_name._M_dataplus._M_p,
             local_a10.m_desc._M_dataplus._M_p,local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,
             local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    (ulong)(local_818.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_990,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x18);
  local_8a0.m_name._M_dataplus._M_p = (pointer)&local_8a0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_8a0,"FlushConstantCost","");
  local_7b0.m_name._M_dataplus._M_p = (pointer)&local_7b0.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b0,"Flush: Approximated contant cost","");
  local_748.m_name._M_dataplus._M_p = (pointer)&local_748.m_name.field_2;
  local_748.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_748.m_name._M_string_length = 2;
  local_748.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,&local_8a0.m_name,&local_7b0.m_name,&local_748.m_name,
             QP_KEY_TAG_TIME,(float)local_990._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a78._0_8_,
             local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,local_a18,local_a14);
  local_970.m_name._M_dataplus._M_p = (pointer)&local_970.m_name.field_2;
  local_970.m_name.field_2._M_allocated_capacity._0_5_ = 0x6873756c46;
  local_970.m_name.field_2._M_allocated_capacity._5_2_ = 0x694c;
  local_970.m_name.field_2._M_local_buf[7] = 'n';
  local_970.m_name.field_2._8_5_ = 0x6f43726165;
  local_970.m_name.field_2._M_local_buf[0xd] = 's';
  local_970.m_name.field_2._M_local_buf[0xe] = 't';
  local_970.m_name._M_string_length = 0xf;
  local_970.m_name.field_2._M_local_buf[0xf] = '\0';
  local_818.m_name._M_dataplus._M_p = (pointer)&local_818.m_name.field_2;
  local_a10.m_name._M_dataplus._M_p = (char *)0x1f;
  local_818.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_818,(ulong)&local_a10);
  local_818.m_name.field_2._M_allocated_capacity = (size_type)local_a10.m_name._M_dataplus._M_p;
  builtin_strncpy(local_818.m_name._M_dataplus._M_p,"Flush: Approximated linear cost",0x1f);
  local_818.m_name._M_string_length = (size_type)local_a10.m_name._M_dataplus._M_p;
  local_818.m_name._M_dataplus._M_p[(long)local_a10.m_name._M_dataplus._M_p] = '\0';
  local_3b0.m_name._M_dataplus._M_p = (pointer)&local_3b0.m_name.field_2;
  local_3b0.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_3b0.m_name._M_string_length = 7;
  local_3b0.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae8,&local_970.m_name,&local_818.m_name,&local_3b0.m_name,
             QP_KEY_TAG_TIME,(float)local_990._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ae8._0_8_,
             local_ac8._M_dataplus._M_p,local_aa8._M_dataplus._M_p,local_a88,local_a84);
  local_908.m_name.field_2._M_allocated_capacity._0_4_ = 0x73756c46;
  local_908.m_name.field_2._M_local_buf[4] = 'h';
  local_908.m_name.field_2._M_allocated_capacity._5_2_ = 0x654d;
  local_908.m_name.field_2._M_local_buf[7] = 'd';
  local_908.m_name.field_2._8_5_ = 0x6f436e6169;
  local_908.m_name.field_2._M_local_buf[0xd] = 's';
  local_908.m_name.field_2._M_local_buf[0xe] = 't';
  local_908.m_name._M_string_length = 0xf;
  local_908.m_name.field_2._M_local_buf[0xf] = '\0';
  local_678.m_name._M_dataplus._M_p = (pointer)&local_678.m_name.field_2;
  local_6e0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_908.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_678.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_678,(ulong)&local_6e0);
  local_678.m_name.field_2._M_allocated_capacity = (size_type)local_6e0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_678.m_name._M_dataplus._M_p,"Flush: Median cost",0x12);
  local_678.m_name._M_string_length = (size_type)local_6e0.m_name._M_dataplus._M_p;
  local_678.m_name._M_dataplus._M_p[(long)local_6e0.m_name._M_dataplus._M_p] = '\0';
  local_6e0.m_name._M_dataplus._M_p = (pointer)&local_6e0.m_name.field_2;
  local_6e0.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_6e0.m_name._M_string_length = 2;
  local_6e0.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_908.m_name,&local_678.m_name,&local_6e0.m_name,QP_KEY_TAG_TIME,
             local_d0[0].medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_a10.m_name._M_dataplus._M_p,
             local_a10.m_desc._M_dataplus._M_p,local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,
             local_a10.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    (ulong)(local_818.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_838._M_dataplus._M_p);
  local_a78._0_8_ = &aStack_a68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a78,"Results","");
  local_ae8._0_8_ = &local_ad8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ae8,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            (&local_298,(TestLog *)&log_00->_M_allocated_capacity,(string *)local_a78,
             (string *)local_ae8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar17 = (float)((pUVar3[-1].bufferSize + pUVar9->bufferSize) / 2);
  local_2e4 = local_60c.coefficient * fVar17;
  local_2e0 = local_60c.offset + local_2e4;
  uVar13 = (long)pUVar3 - (long)pUVar9;
  endNdx = (int)(((uint)(uVar13 >> 0x25) & 1) + (int)(uVar13 >> 6)) >> 1;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,0,endNdx,1,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_ae8,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),1,0x28);
  pUVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pUVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)pUVar9->writtenSize;
  local_2bc = (float)pUVar3[-1].writtenSize;
  local_9a8._0_4_ = fVar16;
  local_2c8 = (float)local_a78._0_4_;
  local_48 = ZEXT416((uint)local_a78._12_4_);
  local_2c4 = (float)local_ae8._0_4_;
  local_58 = ZEXT416((uint)fStack_adc);
  local_2c0 = getAreaBetweenLines(fVar16,local_2bc,(float)local_a78._0_4_,(float)local_a78._12_4_,
                                  (float)local_ae8._0_4_,fStack_adc);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_a78,samples,0,
             (int)((ulong)((long)pUVar3 - (long)pUVar9) >> 6),2,0x28);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>
            ((LineParametersWithConfidence *)local_ae8,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 6),2,0x28);
  local_2cc = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->writtenSize;
  local_2d0 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::MapBufferRangeFlushDurationNoAlloc>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].writtenSize;
  local_2dc = (float)local_a78._0_4_;
  local_68 = ZEXT416((uint)local_a78._12_4_);
  local_2d8 = (float)local_ae8._0_4_;
  local_78 = ZEXT416((uint)fStack_adc);
  local_2d4 = getAreaBetweenLines(local_2cc,local_2d0,(float)local_a78._0_4_,(float)local_a78._12_4_
                                  ,(float)local_ae8._0_4_,fStack_adc);
  local_990._0_8_ = &local_980;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_990,"ResultLinearity","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"Sample linearity","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"%","");
  fVar16 = (float)local_48._0_4_ * (float)local_9a8._0_4_ + local_2c8;
  fVar18 = (float)local_58._0_4_ * (float)local_9a8._0_4_ + local_2c4;
  uVar14 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_48._0_4_ * local_2bc + local_2c8;
  fVar20 = (float)local_58._0_4_ * local_2bc + local_2c4;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar14 & (uint)fVar18 | (uint)fVar16 & uVar14)) *
           (local_2bc - (float)local_9a8._0_4_);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_2c0 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a78,(string *)local_990,&local_838,&local_308,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a78._0_8_,
             local_a58._M_dataplus._M_p,local_a38._M_dataplus._M_p,local_a18,local_a14);
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_328,"SampleTemporalStability","")
  ;
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_348,"Sample temporal stability","");
  local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"%","");
  fVar16 = (float)local_68._0_4_ * local_2cc + local_2dc;
  fVar18 = (float)local_78._0_4_ * local_2cc + local_2d8;
  uVar14 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_68._0_4_ * local_2d0 + local_2dc;
  fVar20 = (float)local_78._0_4_ * local_2d0 + local_2d8;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar14 & (uint)fVar18 | (uint)fVar16 & uVar14)) * (local_2d0 - local_2cc);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_2d4 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ae8,&local_328,&local_348,&local_3d0,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ae8._0_8_,
             local_ac8._M_dataplus._M_p,local_aa8._M_dataplus._M_p,local_a88,local_a84);
  local_3f0._M_dataplus._M_p = (pointer)&local_3f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,"ApproximatedConstantCost","");
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_410,"Approximated contant cost","");
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_430,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_a10,&local_3f0,&local_410,&local_430,QP_KEY_TAG_TIME,local_60c.offset);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_a10.m_name._M_dataplus._M_p,
             local_a10.m_desc._M_dataplus._M_p,local_a10.m_unit._M_dataplus._M_p,local_a10.m_tag,
             local_a10.m_value);
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_450,"ApproximatedConstantCostConfidence60Lower","");
  local_470._M_dataplus._M_p = (pointer)&local_470.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_470,"Approximated contant cost 60% confidence lower limit","");
  local_490._M_dataplus._M_p = (pointer)&local_490.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_490,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_8a0,&local_450,&local_470,&local_490,QP_KEY_TAG_TIME,
             local_60c.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_8a0.m_name._M_dataplus._M_p,
             local_8a0.m_desc._M_dataplus._M_p,local_8a0.m_unit._M_dataplus._M_p,local_8a0.m_tag,
             local_8a0.m_value);
  local_4b0._M_dataplus._M_p = (pointer)&local_4b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4b0,"ApproximatedConstantCostConfidence60Upper","");
  local_4d0._M_dataplus._M_p = (pointer)&local_4d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_4d0,"Approximated contant cost 60% confidence upper limit","");
  local_4f0._M_dataplus._M_p = (pointer)&local_4f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f0,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_7b0,&local_4b0,&local_4d0,&local_4f0,QP_KEY_TAG_TIME,
             local_60c.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_7b0.m_name._M_dataplus._M_p,
             local_7b0.m_desc._M_dataplus._M_p,local_7b0.m_unit._M_dataplus._M_p,local_7b0.m_tag,
             local_7b0.m_value);
  local_510._M_dataplus._M_p = (pointer)&local_510.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_510,"ApproximatedLinearCost","");
  local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_530,"Approximated linear cost","");
  local_550._M_dataplus._M_p = (pointer)&local_550.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_550,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_748,&local_510,&local_530,&local_550,QP_KEY_TAG_TIME,
             local_60c.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_748.m_name._M_dataplus._M_p,
             local_748.m_desc._M_dataplus._M_p,local_748.m_unit._M_dataplus._M_p,local_748.m_tag,
             local_748.m_value);
  local_570._M_dataplus._M_p = (pointer)&local_570.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_570,"ApproximatedLinearCostConfidence60Lower","");
  local_590._M_dataplus._M_p = (pointer)&local_590.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_590,"Approximated linear cost 60% confidence lower limit","");
  local_5b0._M_dataplus._M_p = (pointer)&local_5b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b0,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_970,&local_570,&local_590,&local_5b0,QP_KEY_TAG_TIME,
             local_60c.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_970.m_name._M_dataplus._M_p,
             local_970.m_desc._M_dataplus._M_p,local_970.m_unit._M_dataplus._M_p,local_970.m_tag,
             local_970.m_value);
  local_5d0._M_dataplus._M_p = (pointer)&local_5d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5d0,"ApproximatedLinearCostConfidence60Upper","");
  local_5f0._M_dataplus._M_p = (pointer)&local_5f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_5f0,"Approximated linear cost 60% confidence upper limit","");
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_818,&local_5d0,&local_5f0,&local_2b8,QP_KEY_TAG_TIME,
             local_60c.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_818.m_name._M_dataplus._M_p,
             local_818.m_desc._M_dataplus._M_p,local_818.m_unit._M_dataplus._M_p,local_818.m_tag,
             local_818.m_value);
  local_1f0._M_dataplus._M_p = (pointer)&local_1f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1f0,"ApproximatedTransferRate","");
  local_210._M_dataplus._M_p = (pointer)&local_210.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_210,"Approximated transfer rate","");
  local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"MB / s","");
  fVar16 = fVar17 / ((local_2e0 / 1000.0) / 1000.0);
  local_9a8 = ZEXT416((uint)fVar16);
  tcu::LogNumber<float>::LogNumber
            (&local_3b0,&local_1f0,&local_210,&local_230,QP_KEY_TAG_PERFORMANCE,
             fVar16 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_3b0.m_name._M_dataplus._M_p,
             local_3b0.m_desc._M_dataplus._M_p,local_3b0.m_unit._M_dataplus._M_p,local_3b0.m_tag,
             local_3b0.m_value);
  local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_250,"ApproximatedTransferRateNoConstant","");
  local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_270,"Approximated transfer rate without constant cost","");
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_908,&local_250,&local_270,&local_290,QP_KEY_TAG_PERFORMANCE,
             (fVar17 / ((local_2e4 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_908.m_name._M_dataplus._M_p,
             local_908.m_desc._M_dataplus._M_p,local_908.m_unit._M_dataplus._M_p,local_908.m_tag,
             local_908.m_value);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"SampleMedianTime","");
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Median sample time","");
  local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_170,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_678,&local_130,&local_150,&local_170,QP_KEY_TAG_TIME,local_a0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_678.m_name._M_dataplus._M_p,
             local_678.m_desc._M_dataplus._M_p,local_678.m_unit._M_dataplus._M_p,local_678.m_tag,
             local_678.m_value);
  local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"SampleMedianTransfer","");
  local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b0,"Median transfer rate","");
  local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_6e0,&local_190,&local_1b0,&local_1d0,QP_KEY_TAG_PERFORMANCE,
             local_94 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&local_a80->_M_allocated_capacity,local_6e0.m_name._M_dataplus._M_p,
             local_6e0.m_desc._M_dataplus._M_p,local_6e0.m_unit._M_dataplus._M_p,local_6e0.m_tag,
             local_6e0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_unit._M_dataplus._M_p != &local_6e0.m_unit.field_2) {
    operator_delete(local_6e0.m_unit._M_dataplus._M_p,
                    local_6e0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_desc._M_dataplus._M_p != &local_6e0.m_desc.field_2) {
    operator_delete(local_6e0.m_desc._M_dataplus._M_p,
                    local_6e0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6e0.m_name._M_dataplus._M_p != &local_6e0.m_name.field_2) {
    operator_delete(local_6e0.m_name._M_dataplus._M_p,
                    CONCAT17(local_6e0.m_name.field_2._M_local_buf[7],
                             CONCAT43(local_6e0.m_name.field_2._M_allocated_capacity._3_4_,
                                      CONCAT12(local_6e0.m_name.field_2._M_local_buf[2],
                                               local_6e0.m_name.field_2._M_allocated_capacity._0_2_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_190._M_dataplus._M_p != &local_190.field_2) {
    operator_delete(local_190._M_dataplus._M_p,local_190.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_unit._M_dataplus._M_p != &local_678.m_unit.field_2) {
    operator_delete(local_678.m_unit._M_dataplus._M_p,
                    local_678.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_desc._M_dataplus._M_p != &local_678.m_desc.field_2) {
    operator_delete(local_678.m_desc._M_dataplus._M_p,
                    local_678.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678.m_name._M_dataplus._M_p != &local_678.m_name.field_2) {
    operator_delete(local_678.m_name._M_dataplus._M_p,
                    local_678.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_170._M_dataplus._M_p != &local_170.field_2) {
    operator_delete(local_170._M_dataplus._M_p,local_170.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_dataplus._M_p != &local_150.field_2) {
    operator_delete(local_150._M_dataplus._M_p,local_150.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,local_130.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_unit._M_dataplus._M_p != &local_908.m_unit.field_2) {
    operator_delete(local_908.m_unit._M_dataplus._M_p,
                    local_908.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_desc._M_dataplus._M_p != &local_908.m_desc.field_2) {
    operator_delete(local_908.m_desc._M_dataplus._M_p,
                    local_908.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_908.m_name._M_dataplus._M_p != &local_908.m_name.field_2) {
    operator_delete(local_908.m_name._M_dataplus._M_p,
                    CONCAT17(local_908.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_908.m_name.field_2._M_allocated_capacity._5_2_,
                                      CONCAT14(local_908.m_name.field_2._M_local_buf[4],
                                               local_908.m_name.field_2._M_allocated_capacity._0_4_)
                                     )) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_270._M_dataplus._M_p != &local_270.field_2) {
    operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_250._M_dataplus._M_p != &local_250.field_2) {
    operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_unit._M_dataplus._M_p != &local_3b0.m_unit.field_2) {
    operator_delete(local_3b0.m_unit._M_dataplus._M_p,
                    local_3b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_desc._M_dataplus._M_p != &local_3b0.m_desc.field_2) {
    operator_delete(local_3b0.m_desc._M_dataplus._M_p,
                    local_3b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b0.m_name._M_dataplus._M_p != &local_3b0.m_name.field_2) {
    operator_delete(local_3b0.m_name._M_dataplus._M_p,
                    CONCAT44(local_3b0.m_name.field_2._M_allocated_capacity._4_4_,
                             local_3b0.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_230._M_dataplus._M_p != &local_230.field_2) {
    operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_210._M_dataplus._M_p != &local_210.field_2) {
    operator_delete(local_210._M_dataplus._M_p,local_210.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
    operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_unit._M_dataplus._M_p != &local_818.m_unit.field_2) {
    operator_delete(local_818.m_unit._M_dataplus._M_p,
                    local_818.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_desc._M_dataplus._M_p != &local_818.m_desc.field_2) {
    operator_delete(local_818.m_desc._M_dataplus._M_p,
                    local_818.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818.m_name._M_dataplus._M_p != &local_818.m_name.field_2) {
    operator_delete(local_818.m_name._M_dataplus._M_p,
                    (ulong)(local_818.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,local_2b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5f0._M_dataplus._M_p != &local_5f0.field_2) {
    operator_delete(local_5f0._M_dataplus._M_p,
                    CONCAT53(local_5f0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_5f0.field_2._M_local_buf[2],
                                      local_5f0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d0._M_dataplus._M_p != &local_5d0.field_2) {
    operator_delete(local_5d0._M_dataplus._M_p,local_5d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_unit._M_dataplus._M_p != &local_970.m_unit.field_2) {
    operator_delete(local_970.m_unit._M_dataplus._M_p,
                    local_970.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_desc._M_dataplus._M_p != &local_970.m_desc.field_2) {
    operator_delete(local_970.m_desc._M_dataplus._M_p,
                    local_970.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_970.m_name._M_dataplus._M_p != &local_970.m_name.field_2) {
    operator_delete(local_970.m_name._M_dataplus._M_p,
                    CONCAT17(local_970.m_name.field_2._M_local_buf[7],
                             CONCAT25(local_970.m_name.field_2._M_allocated_capacity._5_2_,
                                      local_970.m_name.field_2._M_allocated_capacity._0_5_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b0._M_dataplus._M_p != &local_5b0.field_2) {
    operator_delete(local_5b0._M_dataplus._M_p,
                    CONCAT17(local_5b0.field_2._M_local_buf[7],
                             local_5b0.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_590._M_dataplus._M_p != &local_590.field_2) {
    operator_delete(local_590._M_dataplus._M_p,
                    CONCAT53(local_590.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_590.field_2._M_local_buf[2],
                                      local_590.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_570._M_dataplus._M_p != &local_570.field_2) {
    operator_delete(local_570._M_dataplus._M_p,local_570.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_unit._M_dataplus._M_p != &local_748.m_unit.field_2) {
    operator_delete(local_748.m_unit._M_dataplus._M_p,
                    local_748.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_desc._M_dataplus._M_p != &local_748.m_desc.field_2) {
    operator_delete(local_748.m_desc._M_dataplus._M_p,
                    local_748.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_748.m_name._M_dataplus._M_p != &local_748.m_name.field_2) {
    operator_delete(local_748.m_name._M_dataplus._M_p,
                    CONCAT53(local_748.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_748.m_name.field_2._M_local_buf[2],
                                      local_748.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_550._M_dataplus._M_p != &local_550.field_2) {
    operator_delete(local_550._M_dataplus._M_p,local_550.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530._M_dataplus._M_p != &local_530.field_2) {
    operator_delete(local_530._M_dataplus._M_p,
                    CONCAT53(local_530.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_530.field_2._M_local_buf[2],
                                      local_530.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_510._M_dataplus._M_p != &local_510.field_2) {
    operator_delete(local_510._M_dataplus._M_p,local_510.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_unit._M_dataplus._M_p != &local_7b0.m_unit.field_2) {
    operator_delete(local_7b0.m_unit._M_dataplus._M_p,
                    local_7b0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_desc._M_dataplus._M_p != &local_7b0.m_desc.field_2) {
    operator_delete(local_7b0.m_desc._M_dataplus._M_p,
                    local_7b0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b0.m_name._M_dataplus._M_p != &local_7b0.m_name.field_2) {
    operator_delete(local_7b0.m_name._M_dataplus._M_p,
                    local_7b0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f0._M_dataplus._M_p != &local_4f0.field_2) {
    operator_delete(local_4f0._M_dataplus._M_p,local_4f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d0._M_dataplus._M_p != &local_4d0.field_2) {
    operator_delete(local_4d0._M_dataplus._M_p,
                    CONCAT53(local_4d0.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_4d0.field_2._M_local_buf[2],
                                      local_4d0.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b0._M_dataplus._M_p != &local_4b0.field_2) {
    operator_delete(local_4b0._M_dataplus._M_p,local_4b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_unit._M_dataplus._M_p != &local_8a0.m_unit.field_2) {
    operator_delete(local_8a0.m_unit._M_dataplus._M_p,
                    local_8a0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_desc._M_dataplus._M_p != &local_8a0.m_desc.field_2) {
    operator_delete(local_8a0.m_desc._M_dataplus._M_p,
                    local_8a0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8a0.m_name._M_dataplus._M_p != &local_8a0.m_name.field_2) {
    operator_delete(local_8a0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8a0.m_name.field_2._M_local_buf[7],
                             local_8a0.m_name.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_490._M_dataplus._M_p != &local_490.field_2) {
    operator_delete(local_490._M_dataplus._M_p,local_490.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_470._M_dataplus._M_p != &local_470.field_2) {
    operator_delete(local_470._M_dataplus._M_p,
                    CONCAT53(local_470.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_470.field_2._M_local_buf[2],
                                      local_470.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,local_450.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_unit._M_dataplus._M_p != &local_a10.m_unit.field_2) {
    operator_delete(local_a10.m_unit._M_dataplus._M_p,
                    local_a10.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_desc._M_dataplus._M_p != &local_a10.m_desc.field_2) {
    operator_delete(local_a10.m_desc._M_dataplus._M_p,
                    local_a10.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10.m_name._M_dataplus._M_p != &local_a10.m_name.field_2) {
    operator_delete(local_a10.m_name._M_dataplus._M_p,
                    local_a10.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p,
                    CONCAT44(local_430.field_2._M_allocated_capacity._4_4_,
                             local_430.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p,
                    CONCAT53(local_410.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_410.field_2._M_local_buf[2],
                                      local_410.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != &local_3f0.field_2) {
    operator_delete(local_3f0._M_dataplus._M_p,local_3f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa8._M_dataplus._M_p != &local_aa8.field_2) {
    operator_delete(local_aa8._M_dataplus._M_p,local_aa8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac8._M_dataplus._M_p != &local_ac8.field_2) {
    operator_delete(local_ac8._M_dataplus._M_p,local_ac8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ae8._0_8_ != &local_ad8) {
    operator_delete((void *)local_ae8._0_8_,local_ad8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d0._M_dataplus._M_p != &local_3d0.field_2) {
    operator_delete(local_3d0._M_dataplus._M_p,local_3d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,
                    CONCAT26(local_348.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_348.field_2._M_allocated_capacity._4_2_,
                                      local_348.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,
                    CONCAT17(local_328.field_2._M_local_buf[7],
                             local_328.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a38._M_dataplus._M_p != &local_a38.field_2) {
    operator_delete(local_a38._M_dataplus._M_p,local_a38.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a58._M_dataplus._M_p != &local_a58.field_2) {
    operator_delete(local_a58._M_dataplus._M_p,local_a58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a78._0_8_ != &aStack_a68) {
    operator_delete((void *)local_a78._0_8_,aStack_a68._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,
                    CONCAT26(local_838.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_838.field_2._M_allocated_capacity._4_2_,
                                      local_838.field_2._M_allocated_capacity._0_4_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_990._0_8_ != &local_980) {
    operator_delete((void *)local_990._0_8_,local_980._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection(local_298.m_log);
  UVar21.transferRateAtRange = (float)local_9a8._0_4_;
  UVar21.transferRateMedian = local_94;
  UVar21.transferRateAtInfinity = local_94;
  return UVar21;
}

Assistant:

static UploadSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<UploadSampleResult<SampleType> >& samples, bool logBucketPerformance)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedTransferRate;
	float													approximatedTransferRateNoConstant;

	// Output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Calculate results for different ranges
	if (logBucketPerformance)
	{
		const int										numBuckets				= 4;
		int												minBufferSize			= 0;
		int												maxBufferSize			= 0;
		std::vector<UploadSampleResult<SampleType> >	buckets[numBuckets];

		bucketizeSamplesUniformly(samples, &buckets[0], numBuckets, minBufferSize, maxBufferSize);

		for (int bucketNdx = 0; bucketNdx < numBuckets; ++bucketNdx)
		{
			if (buckets[bucketNdx].empty())
				continue;

			// Print a nice result summary

			const int												bucketRangeMin	= minBufferSize + (int)(((float) bucketNdx    / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const int												bucketRangeMax	= minBufferSize + (int)(((float)(bucketNdx+1) / (float)numBuckets) * (float)(maxBufferSize - minBufferSize));
			const typename SampleTypeTraits<SampleType>::StatsType	stats			= calculateSampleStatistics(theilSenFitting, buckets[bucketNdx]);
			const tcu::ScopedLogSection								section			(log, "BufferSizeRange", std::string("Transfer performance with buffer size in range [").append(getHumanReadableByteSize(bucketRangeMin).append(", ").append(getHumanReadableByteSize(bucketRangeMax).append("]"))));

			logMapRangeStats<SampleType>(log, stats);
			logUnmapStats<SampleType>(log, stats);
			logWriteStats<SampleType>(log, stats);
			logFlushStats<SampleType>(log, stats);
			logAllocStats<SampleType>(log, stats);

			log	<< tcu::TestLog::Float("Min", "Total: Min time", "us", QP_KEY_TAG_TIME, stats.result.minTime)
				<< tcu::TestLog::Float("Max", "Total: Max time", "us", QP_KEY_TAG_TIME, stats.result.maxTime)
				<< tcu::TestLog::Float("Min90", "Total: 90%-Min time", "us", QP_KEY_TAG_TIME, stats.result.min2DecileTime)
				<< tcu::TestLog::Float("Max90", "Total: 90%-Max time", "us", QP_KEY_TAG_TIME, stats.result.max9DecileTime)
				<< tcu::TestLog::Float("Median", "Total: Median time", "us", QP_KEY_TAG_TIME, stats.result.medianTime)
				<< tcu::TestLog::Float("MedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, stats.medianRate / 1024.0f / 1024.0f)
				<< tcu::TestLog::Float("MaxDiff", "Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiffTime)
				<< tcu::TestLog::Float("Max90Diff", "90%-Max difference to approximated", "us", QP_KEY_TAG_TIME, stats.maxDiff9DecileTime)
				<< tcu::TestLog::Float("MedianDiff", "Median difference to approximated", "us", QP_KEY_TAG_TIME, stats.medianDiffTime)
				<< tcu::TestLog::Float("MaxRelDiff", "Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.maxRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("Max90RelDiff", "90%-Max relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.max9DecileRelDiffTime * 100.0f)
				<< tcu::TestLog::Float("MedianRelDiff", "Median relative difference to approximated", "%", QP_KEY_TAG_NONE, stats.medianRelDiffTime * 100.0f);
		}
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logMapContribution(log, samples, resultStats);
		logUnmapContribution(log, samples, resultStats);
		logWriteContribution(log, samples, resultStats);
		logFlushContribution(log, samples, resultStats);
		logAllocContribution(log, samples, resultStats);
	}

	// Print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianBufferSize					= (samples.front().bufferSize + samples.back().bufferSize) / 2;
		const float	approximatedTransferTime			= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	approximatedTransferTimeNoConstant	= (theilSenFitting.coefficient * (float)medianBufferSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedTransferRateNoConstant				= (float)medianBufferSize / approximatedTransferTimeNoConstant;
		approximatedTransferRate						= (float)medianBufferSize / approximatedTransferTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRate", "Approximated transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedTransferRateNoConstant", "Approximated transfer rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedTransferRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianTransfer", "Median transfer rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated transfer rate
	{
		UploadSampleAnalyzeResult result;

		result.transferRateMedian = resultStats.medianRate;
		result.transferRateAtRange = approximatedTransferRate;
		result.transferRateAtInfinity = approximatedTransferRateNoConstant;

		return result;
	}
}